

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_exporter.cpp
# Opt level: O3

void Assimp::Write(JSONWriter *out,aiMatrix4x4 *ai,bool is_elem)

{
  uint x;
  
  JSONWriter::StartArray(out,is_elem);
  JSONWriter::Element<float>(out,&ai->a1);
  (*(code *)&LAB_003a3066)();
  return;
}

Assistant:

void Write(JSONWriter& out, const aiMatrix4x4& ai, bool is_elem = true) {
    out.StartArray(is_elem);
    for (unsigned int x = 0; x < 4; ++x) {
        for (unsigned int y = 0; y < 4; ++y) {
            out.Element(ai[x][y]);
        }
    }
    out.EndArray();
}